

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  int fb;
  int fa;
  string sb;
  string sa;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> b;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> a;
  int local_b0;
  int local_ac;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [40];
  undefined1 local_40 [40];
  
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  std::operator<<((ostream *)&std::cout,"Enter CP::pair<int,string> A: ");
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_ac);
  std::operator>>(piVar1,(string *)&local_88);
  std::operator<<((ostream *)&std::cout,"Enter CP::pair<int,string> B: ");
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_b0);
  std::operator>>(piVar1,(string *)&local_a8);
  local_40._0_4_ = local_ac;
  std::__cxx11::string::string((string *)(local_40 + 8),(string *)&local_88);
  local_68._0_4_ = local_b0;
  std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_a8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Result of a >= b is ");
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Result of b >= a is ");
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return 0;
}

Assistant:

int main() {
    int fa,fb;
    std::string sa,sb;

    std::cout << "Enter CP::pair<int,string> A: ";
    std::cin >> fa >> sa;
    std::cout << "Enter CP::pair<int,string> B: ";
    std::cin >> fb >> sb;

    CP::pair<int,std::string> a(fa,sa), b(fb,sb);

    std::cout << "Result of a >= b is " << (a >= b) << std::endl;
    std::cout << "Result of b >= a is " << (b >= a) << std::endl;
}